

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nw_stats_scan_sse41_128_16.c
# Opt level: O1

parasail_result_t *
parasail_nw_stats_scan_profile_sse41_128_16
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap)

{
  ushort *puVar1;
  short *psVar2;
  void *pvVar3;
  parasail_matrix_t *ppVar4;
  void *pvVar5;
  void *pvVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  int iVar11;
  parasail_result_t *ppVar12;
  __m128i *b;
  __m128i *b_00;
  __m128i *b_01;
  __m128i *b_02;
  __m128i *ptr;
  __m128i *b_03;
  __m128i *b_04;
  __m128i *b_05;
  __m128i *ptr_00;
  __m128i *ptr_01;
  __m128i *ptr_02;
  __m128i *ptr_03;
  __m128i *ptr_04;
  __m128i *ptr_05;
  int16_t *ptr_06;
  long lVar13;
  uint uVar14;
  size_t len;
  long lVar15;
  int iVar16;
  uint uVar17;
  longlong extraout_RDX;
  longlong extraout_RDX_00;
  longlong extraout_RDX_01;
  longlong extraout_RDX_02;
  longlong extraout_RDX_03;
  longlong extraout_RDX_04;
  ulong uVar18;
  int iVar19;
  int16_t iVar20;
  int iVar21;
  ulong uVar22;
  undefined2 uVar23;
  long lVar24;
  uint uVar25;
  ulong uVar26;
  uint uVar27;
  short sVar28;
  short sVar29;
  undefined4 uVar30;
  ulong uVar32;
  short sVar42;
  short sVar46;
  short sVar49;
  short sVar51;
  undefined1 auVar33 [16];
  undefined4 uVar31;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 extraout_XMM0 [16];
  undefined1 auVar36 [16];
  short sVar40;
  short sVar41;
  short sVar43;
  short sVar44;
  short sVar45;
  short sVar47;
  short sVar50;
  short sVar52;
  short sVar53;
  short sVar54;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  ulong uVar48;
  ulong uVar55;
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  ulong uVar62;
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  ulong uVar67;
  ushort uVar68;
  ushort uVar74;
  ushort uVar75;
  ushort uVar76;
  ushort uVar77;
  ushort uVar78;
  ushort uVar79;
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  ushort uVar80;
  undefined1 auVar73 [16];
  ushort uVar81;
  ushort uVar82;
  ushort uVar83;
  ushort uVar84;
  ushort uVar85;
  ushort uVar86;
  ushort uVar87;
  ushort uVar88;
  short sVar89;
  short sVar90;
  short sVar91;
  short sVar92;
  short sVar93;
  short sVar94;
  short sVar95;
  short sVar96;
  undefined1 auVar97 [16];
  short sVar98;
  ushort uVar99;
  short sVar100;
  ushort uVar101;
  short sVar102;
  ushort uVar103;
  short sVar104;
  ushort uVar105;
  short sVar106;
  ushort uVar107;
  short sVar108;
  ushort uVar109;
  short sVar110;
  ushort uVar111;
  short sVar112;
  ushort uVar113;
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  ushort uVar123;
  ushort uVar124;
  ushort uVar125;
  ushort uVar126;
  ushort uVar127;
  ushort uVar128;
  ushort uVar129;
  ushort uVar130;
  __m128i c;
  __m128i c_00;
  __m128i c_01;
  __m128i c_02;
  __m128i c_03;
  __m128i c_04;
  __m128i c_05;
  __m128i_16_t h;
  undefined1 local_228 [16];
  undefined1 local_1e8 [16];
  undefined1 local_1d8 [16];
  undefined1 local_1a8 [16];
  undefined1 local_198 [16];
  ushort local_148;
  ushort uStack_146;
  ushort local_b8;
  ushort uStack_b6;
  longlong local_48;
  longlong lStack_40;
  
  if (profile == (parasail_profile_t *)0x0) {
    parasail_nw_stats_scan_profile_sse41_128_16_cold_8();
  }
  else {
    pvVar3 = (profile->profile16).score;
    if (pvVar3 == (void *)0x0) {
      parasail_nw_stats_scan_profile_sse41_128_16_cold_7();
    }
    else {
      ppVar4 = profile->matrix;
      if (ppVar4 == (parasail_matrix_t *)0x0) {
        parasail_nw_stats_scan_profile_sse41_128_16_cold_6();
      }
      else {
        uVar25 = profile->s1Len;
        if ((int)uVar25 < 1) {
          parasail_nw_stats_scan_profile_sse41_128_16_cold_5();
        }
        else if (s2 == (char *)0x0) {
          parasail_nw_stats_scan_profile_sse41_128_16_cold_4();
        }
        else if (s2Len < 1) {
          parasail_nw_stats_scan_profile_sse41_128_16_cold_3();
        }
        else if (open < 0) {
          parasail_nw_stats_scan_profile_sse41_128_16_cold_2();
        }
        else if (gap < 0) {
          parasail_nw_stats_scan_profile_sse41_128_16_cold_1();
        }
        else {
          iVar19 = uVar25 - 1;
          uVar26 = (ulong)uVar25 + 7 >> 3;
          uVar25 = (uint)uVar26;
          uVar27 = iVar19 % (int)uVar25;
          pvVar5 = (profile->profile16).matches;
          pvVar6 = (profile->profile16).similar;
          iVar16 = -open;
          iVar21 = ppVar4->min;
          local_1a8._0_4_ = iVar16;
          local_198._0_4_ = open;
          iVar11 = -iVar21;
          if (iVar21 != iVar16 && SBORROW4(iVar21,iVar16) == iVar21 + open < 0) {
            iVar11 = open;
          }
          iVar7 = ppVar4->max;
          ppVar12 = parasail_result_new_stats();
          if (ppVar12 != (parasail_result_t *)0x0) {
            ppVar12->flag = ppVar12->flag | 0x8210401;
            b = parasail_memalign___m128i(0x10,uVar26);
            b_00 = parasail_memalign___m128i(0x10,uVar26);
            b_01 = parasail_memalign___m128i(0x10,uVar26);
            b_02 = parasail_memalign___m128i(0x10,uVar26);
            ptr = parasail_memalign___m128i(0x10,uVar26);
            b_03 = parasail_memalign___m128i(0x10,uVar26);
            b_04 = parasail_memalign___m128i(0x10,uVar26);
            b_05 = parasail_memalign___m128i(0x10,uVar26);
            local_1e8._8_8_ = local_1e8._0_8_;
            local_1e8._0_8_ = CONCAT44(0,s2Len);
            ptr_00 = parasail_memalign___m128i(0x10,uVar26);
            ptr_01 = parasail_memalign___m128i(0x10,uVar26);
            ptr_02 = parasail_memalign___m128i(0x10,uVar26);
            ptr_03 = parasail_memalign___m128i(0x10,uVar26);
            ptr_04 = parasail_memalign___m128i(0x10,uVar26);
            ptr_05 = parasail_memalign___m128i(0x10,uVar26);
            ptr_06 = parasail_memalign_int16_t(0x10,(ulong)(s2Len + 1));
            if ((ptr_06 != (int16_t *)0x0 &&
                (ptr_05 != (__m128i *)0x0 && (ptr_04 != (__m128i *)0x0 && ptr_03 != (__m128i *)0x0))
                ) && ((ptr_02 != (__m128i *)0x0 &&
                      (ptr_01 != (__m128i *)0x0 &&
                      (ptr_00 != (__m128i *)0x0 && b_05 != (__m128i *)0x0))) &&
                     ((b_04 != (__m128i *)0x0 && (b_03 != (__m128i *)0x0 && ptr != (__m128i *)0x0))
                     && ((b_02 != (__m128i *)0x0 && b_01 != (__m128i *)0x0) &&
                        (b_00 != (__m128i *)0x0 && b != (__m128i *)0x0))))) {
              iVar8 = s2Len + -1;
              iVar9 = 7 - iVar19 / (int)uVar25;
              auVar33 = pshuflw(ZEXT416((uint)open),ZEXT416((uint)open),0);
              uVar30 = auVar33._0_4_;
              len = (size_t)(uint)gap;
              auVar33 = pshuflw(ZEXT416((uint)gap),ZEXT416((uint)gap),0);
              uVar31 = auVar33._0_4_;
              uVar10 = iVar11 - 0x7fff;
              auVar34 = pshuflw(ZEXT416(uVar10),ZEXT416(uVar10),0);
              local_148 = auVar34._0_2_;
              uStack_146 = auVar34._2_2_;
              auVar33 = ZEXT416(CONCAT22((short)((uint)iVar21 >> 0x10),0x7ffe - (short)iVar7));
              auVar35 = pshuflw(auVar33,auVar33,0);
              auVar56 = pshufb(ZEXT416(uVar25),_DAT_008d2ad0);
              auVar33 = pshufb(ZEXT416(-(uVar25 * gap)),_DAT_008d2ad0);
              auVar63 = paddsw(auVar33,ZEXT416(uVar10 & 0xffff));
              c[1] = uVar26;
              c[0] = uVar26;
              parasail_memset___m128i(b_03,c,len);
              c_00[1] = extraout_RDX;
              c_00[0] = uVar26;
              parasail_memset___m128i(b_04,c_00,len);
              c_01[1] = extraout_RDX_00;
              c_01[0] = uVar26;
              parasail_memset___m128i(b_05,c_01,len);
              c_02[1] = extraout_RDX_01;
              c_02[0] = uVar26;
              parasail_memset___m128i(b,c_02,len);
              c_03[1] = extraout_RDX_02;
              c_03[0] = uVar26;
              parasail_memset___m128i(b_00,c_03,len);
              c_04[1] = extraout_RDX_03;
              c_04[0] = uVar26;
              parasail_memset___m128i(b_01,c_04,len);
              c_05[1] = extraout_RDX_04;
              c_05[0] = uVar26;
              parasail_memset___m128i(b_02,c_05,len);
              auVar33._4_4_ = uVar31;
              auVar33._0_4_ = uVar31;
              auVar33._8_4_ = uVar31;
              auVar33._12_4_ = uVar31;
              auVar121._4_4_ = uVar30;
              auVar121._0_4_ = uVar30;
              auVar121._8_4_ = uVar30;
              auVar121._12_4_ = uVar30;
              auVar64 = psubsw((undefined1  [16])0x0,auVar121);
              uVar14 = uVar25 - 1;
              lVar13 = (ulong)uVar14 << 4;
              auVar36 = pmovsxbw(extraout_XMM0,0x101010101010101);
              uVar18 = uVar26;
              auVar57 = auVar36;
              do {
                *(undefined1 (*) [16])((long)*ptr_04 + lVar13) = auVar64;
                *(undefined1 (*) [16])((long)*ptr_05 + lVar13) = auVar57;
                auVar64 = psubsw(auVar64,auVar33);
                auVar57 = paddsw(auVar57,auVar36);
                lVar13 = lVar13 + -0x10;
                iVar21 = (int)uVar18;
                uVar17 = iVar21 - 1;
                uVar18 = (ulong)uVar17;
              } while (uVar17 != 0 && 0 < iVar21);
              uVar18 = 0;
              iVar21 = iVar16;
              do {
                lVar13 = 0;
                iVar11 = iVar21;
                do {
                  uVar23 = 0x8000;
                  if (-0x8000 < iVar11) {
                    uVar23 = (undefined2)iVar11;
                  }
                  *(undefined2 *)((long)&local_48 + lVar13 * 2) = uVar23;
                  lVar13 = lVar13 + 1;
                  iVar11 = iVar11 - uVar25 * gap;
                } while (lVar13 != 8);
                ptr[uVar18][0] = local_48;
                ptr[uVar18][1] = lStack_40;
                uVar18 = uVar18 + 1;
                iVar21 = iVar21 - gap;
              } while (uVar18 != uVar26);
              *ptr_06 = 0;
              uVar18 = 1;
              do {
                iVar20 = -0x8000;
                if (-0x8000 < iVar16) {
                  iVar20 = (int16_t)iVar16;
                }
                ptr_06[uVar18] = iVar20;
                uVar18 = uVar18 + 1;
                iVar16 = iVar16 - gap;
              } while (s2Len + 1 != uVar18);
              uVar18 = 1;
              if (1 < s2Len) {
                uVar18 = CONCAT44(0,s2Len);
              }
              lVar13 = (ulong)(uVar25 + (uVar25 == 0)) << 4;
              uVar22 = 0;
              local_b8 = auVar35._0_2_;
              uStack_b6 = auVar35._2_2_;
              uVar81 = local_148;
              uVar82 = uStack_146;
              uVar83 = local_148;
              uVar84 = uStack_146;
              uVar85 = local_148;
              uVar86 = uStack_146;
              uVar87 = local_148;
              uVar88 = uStack_146;
              uVar123 = local_b8;
              uVar124 = uStack_b6;
              uVar125 = local_b8;
              uVar126 = uStack_b6;
              uVar127 = local_b8;
              uVar128 = uStack_b6;
              uVar129 = local_b8;
              uVar130 = uStack_b6;
              do {
                uVar67 = ptr[uVar14][0];
                uVar55 = b_03[uVar14][0];
                uVar62 = b_04[uVar14][0];
                uVar32 = b_05[uVar14][0];
                auVar64._0_8_ = uVar55 << 0x10;
                auVar64._8_8_ = b_03[uVar14][1] << 0x10 | uVar55 >> 0x30;
                auVar36._0_8_ = uVar62 << 0x10;
                auVar36._8_8_ = b_04[uVar14][1] << 0x10 | uVar62 >> 0x30;
                auVar35._0_8_ = uVar32 << 0x10;
                auVar35._8_8_ = b_05[uVar14][1] << 0x10 | uVar32 >> 0x30;
                auVar116._8_8_ = ptr[uVar14][1] << 0x10 | uVar67 >> 0x30;
                auVar116._0_8_ = uVar67 << 0x10 | (ulong)(ushort)ptr_06[uVar22];
                lVar24 = (long)ppVar4->mapper[(byte)s2[uVar22]] * uVar26 * 0x10;
                auVar57._4_2_ = local_148;
                auVar57._0_4_ = auVar34._0_4_;
                auVar57._6_2_ = uStack_146;
                auVar57._8_2_ = local_148;
                auVar57._10_2_ = uStack_146;
                auVar57._12_2_ = local_148;
                auVar57._14_2_ = uStack_146;
                auVar58 = psubsw(auVar57,(undefined1  [16])*ptr_04);
                auVar122 = ZEXT816(0);
                lVar15 = 0;
                local_1d8 = ZEXT816(0);
                local_228 = ZEXT816(0);
                do {
                  auVar38 = *(undefined1 (*) [16])((long)*ptr + lVar15);
                  auVar59 = *(undefined1 (*) [16])((long)*b_03 + lVar15);
                  auVar121 = psubsw(auVar38,auVar121);
                  auVar33 = psubsw(*(undefined1 (*) [16])((long)*b + lVar15),auVar33);
                  sVar28 = auVar121._0_2_;
                  sVar98 = auVar33._0_2_;
                  auVar114._0_2_ = -(ushort)(sVar98 < sVar28);
                  sVar40 = auVar121._2_2_;
                  sVar100 = auVar33._2_2_;
                  auVar114._2_2_ = -(ushort)(sVar100 < sVar40);
                  sVar42 = auVar121._4_2_;
                  sVar102 = auVar33._4_2_;
                  auVar114._4_2_ = -(ushort)(sVar102 < sVar42);
                  sVar44 = auVar121._6_2_;
                  sVar104 = auVar33._6_2_;
                  auVar114._6_2_ = -(ushort)(sVar104 < sVar44);
                  sVar46 = auVar121._8_2_;
                  sVar106 = auVar33._8_2_;
                  auVar114._8_2_ = -(ushort)(sVar106 < sVar46);
                  sVar49 = auVar121._10_2_;
                  sVar108 = auVar33._10_2_;
                  auVar114._10_2_ = -(ushort)(sVar108 < sVar49);
                  sVar51 = auVar121._12_2_;
                  sVar110 = auVar33._12_2_;
                  sVar53 = auVar121._14_2_;
                  auVar114._12_2_ = -(ushort)(sVar110 < sVar51);
                  sVar112 = auVar33._14_2_;
                  auVar114._14_2_ = -(ushort)(sVar112 < sVar53);
                  auVar65 = pblendvb(*(undefined1 (*) [16])((long)*b_00 + lVar15),auVar59,auVar114);
                  auVar69 = *(undefined1 (*) [16])((long)*b_04 + lVar15);
                  auVar97 = pblendvb(*(undefined1 (*) [16])((long)*b_01 + lVar15),auVar69,auVar114);
                  auVar70 = *(undefined1 (*) [16])((long)*b_05 + lVar15);
                  auVar114 = pblendvb(*(undefined1 (*) [16])((long)*b_02 + lVar15),auVar70,auVar114)
                  ;
                  auVar121 = paddsw(auVar58,*(undefined1 (*) [16])((long)*ptr_04 + lVar15));
                  sVar29 = auVar121._0_2_;
                  sVar89 = auVar57._0_2_;
                  auVar118._0_2_ = -(ushort)(sVar89 < sVar29);
                  sVar41 = auVar121._2_2_;
                  sVar90 = auVar57._2_2_;
                  auVar118._2_2_ = -(ushort)(sVar90 < sVar41);
                  sVar43 = auVar121._4_2_;
                  sVar91 = auVar57._4_2_;
                  auVar118._4_2_ = -(ushort)(sVar91 < sVar43);
                  sVar45 = auVar121._6_2_;
                  sVar92 = auVar57._6_2_;
                  auVar118._6_2_ = -(ushort)(sVar92 < sVar45);
                  sVar47 = auVar121._8_2_;
                  sVar93 = auVar57._8_2_;
                  auVar118._8_2_ = -(ushort)(sVar93 < sVar47);
                  sVar50 = auVar121._10_2_;
                  sVar94 = auVar57._10_2_;
                  auVar118._10_2_ = -(ushort)(sVar94 < sVar50);
                  sVar52 = auVar121._12_2_;
                  sVar95 = auVar57._12_2_;
                  sVar54 = auVar121._14_2_;
                  auVar118._12_2_ = -(ushort)(sVar95 < sVar52);
                  sVar96 = auVar57._14_2_;
                  auVar118._14_2_ = -(ushort)(sVar96 < sVar54);
                  local_228 = pblendvb(local_228,local_198,auVar118);
                  local_1d8 = pblendvb(local_1d8,local_1e8,auVar118);
                  uVar99 = (ushort)(sVar98 < sVar28) * sVar28 | (ushort)(sVar98 >= sVar28) * sVar98;
                  uVar101 = (ushort)(sVar100 < sVar40) * sVar40 |
                            (ushort)(sVar100 >= sVar40) * sVar100;
                  uVar103 = (ushort)(sVar102 < sVar42) * sVar42 |
                            (ushort)(sVar102 >= sVar42) * sVar102;
                  uVar105 = (ushort)(sVar104 < sVar44) * sVar44 |
                            (ushort)(sVar104 >= sVar44) * sVar104;
                  uVar107 = (ushort)(sVar106 < sVar46) * sVar46 |
                            (ushort)(sVar106 >= sVar46) * sVar106;
                  uVar109 = (ushort)(sVar108 < sVar49) * sVar49 |
                            (ushort)(sVar108 >= sVar49) * sVar108;
                  uVar111 = (ushort)(sVar110 < sVar51) * sVar51 |
                            (ushort)(sVar110 >= sVar51) * sVar110;
                  uVar113 = (ushort)(sVar112 < sVar53) * sVar53 |
                            (ushort)(sVar112 >= sVar53) * sVar112;
                  auVar57._0_2_ =
                       (ushort)(sVar29 < sVar89) * sVar89 | (ushort)(sVar29 >= sVar89) * sVar29;
                  auVar57._2_2_ =
                       (ushort)(sVar41 < sVar90) * sVar90 | (ushort)(sVar41 >= sVar90) * sVar41;
                  auVar57._4_2_ =
                       (ushort)(sVar43 < sVar91) * sVar91 | (ushort)(sVar43 >= sVar91) * sVar43;
                  auVar57._6_2_ =
                       (ushort)(sVar45 < sVar92) * sVar92 | (ushort)(sVar45 >= sVar92) * sVar45;
                  auVar57._8_2_ =
                       (ushort)(sVar47 < sVar93) * sVar93 | (ushort)(sVar47 >= sVar93) * sVar47;
                  auVar57._10_2_ =
                       (ushort)(sVar50 < sVar94) * sVar94 | (ushort)(sVar50 >= sVar94) * sVar50;
                  auVar57._12_2_ =
                       (ushort)(sVar52 < sVar95) * sVar95 | (ushort)(sVar52 >= sVar95) * sVar52;
                  auVar57._14_2_ =
                       (ushort)(sVar54 < sVar96) * sVar96 | (ushort)(sVar54 >= sVar96) * sVar54;
                  auVar58 = paddsw(local_1a8,*(undefined1 (*) [16])((long)*ptr_05 + lVar15));
                  auVar122 = pblendvb(auVar122,auVar58,auVar118);
                  auVar118 = paddsw(auVar116,*(undefined1 (*) [16])((long)pvVar3 + lVar15 + lVar24))
                  ;
                  auVar116 = paddsw(auVar64,*(undefined1 (*) [16])((long)pvVar5 + lVar15 + lVar24));
                  auVar64 = paddsw(auVar36,*(undefined1 (*) [16])((long)pvVar6 + lVar15 + lVar24));
                  sVar28 = auVar118._0_2_;
                  auVar37._0_2_ = -(ushort)(sVar28 < (short)uVar99);
                  sVar29 = auVar118._2_2_;
                  auVar37._2_2_ = -(ushort)(sVar29 < (short)uVar101);
                  sVar40 = auVar118._4_2_;
                  auVar37._4_2_ = -(ushort)(sVar40 < (short)uVar103);
                  sVar41 = auVar118._6_2_;
                  auVar37._6_2_ = -(ushort)(sVar41 < (short)uVar105);
                  sVar42 = auVar118._8_2_;
                  auVar37._8_2_ = -(ushort)(sVar42 < (short)uVar107);
                  sVar43 = auVar118._10_2_;
                  auVar37._10_2_ = -(ushort)(sVar43 < (short)uVar109);
                  sVar44 = auVar118._12_2_;
                  auVar37._12_2_ = -(ushort)(sVar44 < (short)uVar111);
                  sVar45 = auVar118._14_2_;
                  auVar37._14_2_ = -(ushort)(sVar45 < (short)uVar113);
                  local_198 = pblendvb(auVar116,auVar65,auVar37);
                  local_1e8 = pblendvb(auVar64,auVar97,auVar37);
                  auVar121 = pmovsxbw(auVar121,0x101010101010101);
                  auVar36 = paddsw(auVar114,auVar121);
                  auVar35 = paddsw(auVar35,auVar121);
                  local_1a8 = pblendvb(auVar35,auVar36,auVar37);
                  puVar1 = (ushort *)((long)*b + lVar15);
                  *puVar1 = uVar99;
                  puVar1[1] = uVar101;
                  puVar1[2] = uVar103;
                  puVar1[3] = uVar105;
                  puVar1[4] = uVar107;
                  puVar1[5] = uVar109;
                  puVar1[6] = uVar111;
                  puVar1[7] = uVar113;
                  *(undefined1 (*) [16])((long)*b_00 + lVar15) = auVar65;
                  *(undefined1 (*) [16])((long)*b_01 + lVar15) = auVar97;
                  *(undefined1 (*) [16])((long)*b_02 + lVar15) = auVar36;
                  uVar99 = (ushort)((short)uVar99 < sVar28) * sVar28 |
                           ((short)uVar99 >= sVar28) * uVar99;
                  uVar101 = (ushort)((short)uVar101 < sVar29) * sVar29 |
                            ((short)uVar101 >= sVar29) * uVar101;
                  uVar103 = (ushort)((short)uVar103 < sVar40) * sVar40 |
                            ((short)uVar103 >= sVar40) * uVar103;
                  uVar105 = (ushort)((short)uVar105 < sVar41) * sVar41 |
                            ((short)uVar105 >= sVar41) * uVar105;
                  auVar58._0_8_ = CONCAT26(uVar105,CONCAT24(uVar103,CONCAT22(uVar101,uVar99)));
                  auVar58._8_2_ =
                       (ushort)((short)uVar107 < sVar42) * sVar42 |
                       ((short)uVar107 >= sVar42) * uVar107;
                  auVar58._10_2_ =
                       (ushort)((short)uVar109 < sVar43) * sVar43 |
                       ((short)uVar109 >= sVar43) * uVar109;
                  auVar58._12_2_ =
                       (ushort)((short)uVar111 < sVar44) * sVar44 |
                       ((short)uVar111 >= sVar44) * uVar111;
                  auVar58._14_2_ =
                       (ushort)((short)uVar113 < sVar45) * sVar45 |
                       ((short)uVar113 >= sVar45) * uVar113;
                  *(undefined1 (*) [16])((long)*ptr + lVar15) = auVar118;
                  *(undefined1 (*) [16])((long)*b_03 + lVar15) = auVar116;
                  *(undefined1 (*) [16])((long)*b_04 + lVar15) = auVar64;
                  *(undefined1 (*) [16])((long)*b_05 + lVar15) = auVar35;
                  lVar15 = lVar15 + 0x10;
                  auVar35 = auVar70;
                  auVar36 = auVar69;
                  auVar64 = auVar59;
                  auVar116 = auVar38;
                } while (lVar13 != lVar15);
                lVar15 = local_198._8_8_;
                uVar67 = local_198._0_8_;
                local_198._0_8_ = uVar67 << 0x10;
                local_198._8_8_ = lVar15 << 0x10 | uVar67 >> 0x30;
                lVar15 = local_1e8._8_8_;
                uVar67 = local_1e8._0_8_;
                local_1e8._0_8_ = uVar67 << 0x10;
                local_1e8._8_8_ = lVar15 << 0x10 | uVar67 >> 0x30;
                lVar15 = local_1a8._8_8_;
                uVar67 = local_1a8._0_8_;
                local_1a8._0_8_ = uVar67 << 0x10;
                local_1a8._8_8_ = lVar15 << 0x10 | uVar67 >> 0x30;
                auVar59._8_8_ = auVar58._8_8_ << 0x10 | (ulong)uVar105;
                uVar107 = ptr_06[uVar22 + 1];
                auVar59._0_8_ = auVar58._0_8_ << 0x10 | (ulong)uVar107;
                uVar22 = uVar22 + 1;
                auVar35 = paddsw((undefined1  [16])*ptr_04,auVar59);
                sVar28 = auVar35._0_2_;
                auVar38._0_2_ = -(ushort)(sVar28 < (short)auVar57._0_2_);
                sVar29 = auVar35._2_2_;
                auVar38._2_2_ = -(ushort)(sVar29 < (short)auVar57._2_2_);
                sVar40 = auVar35._4_2_;
                auVar38._4_2_ = -(ushort)(sVar40 < (short)auVar57._4_2_);
                sVar41 = auVar35._6_2_;
                auVar38._6_2_ = -(ushort)(sVar41 < (short)auVar57._6_2_);
                sVar42 = auVar35._8_2_;
                auVar38._8_2_ = -(ushort)(sVar42 < (short)auVar57._8_2_);
                sVar43 = auVar35._10_2_;
                auVar38._10_2_ = -(ushort)(sVar43 < (short)auVar57._10_2_);
                sVar44 = auVar35._12_2_;
                auVar38._12_2_ = -(ushort)(sVar44 < (short)auVar57._12_2_);
                sVar45 = auVar35._14_2_;
                auVar38._14_2_ = -(ushort)(sVar45 < (short)auVar57._14_2_);
                auVar69._0_2_ =
                     (sVar28 < (short)auVar57._0_2_) * auVar57._0_2_ |
                     (ushort)(sVar28 >= (short)auVar57._0_2_) * sVar28;
                auVar69._2_2_ =
                     (sVar29 < (short)auVar57._2_2_) * auVar57._2_2_ |
                     (ushort)(sVar29 >= (short)auVar57._2_2_) * sVar29;
                auVar69._4_2_ =
                     (sVar40 < (short)auVar57._4_2_) * auVar57._4_2_ |
                     (ushort)(sVar40 >= (short)auVar57._4_2_) * sVar40;
                auVar69._6_2_ =
                     (sVar41 < (short)auVar57._6_2_) * auVar57._6_2_ |
                     (ushort)(sVar41 >= (short)auVar57._6_2_) * sVar41;
                auVar69._8_2_ =
                     (sVar42 < (short)auVar57._8_2_) * auVar57._8_2_ |
                     (ushort)(sVar42 >= (short)auVar57._8_2_) * sVar42;
                auVar69._10_2_ =
                     (sVar43 < (short)auVar57._10_2_) * auVar57._10_2_ |
                     (ushort)(sVar43 >= (short)auVar57._10_2_) * sVar43;
                auVar69._12_2_ =
                     (sVar44 < (short)auVar57._12_2_) * auVar57._12_2_ |
                     (ushort)(sVar44 >= (short)auVar57._12_2_) * sVar44;
                auVar69._14_2_ =
                     (sVar45 < (short)auVar57._14_2_) * auVar57._14_2_ |
                     (ushort)(sVar45 >= (short)auVar57._14_2_) * sVar45;
                auVar57 = pblendvb(local_198,local_228,auVar38);
                auVar35 = pblendvb(local_1e8,local_1d8,auVar38);
                auVar36 = paddsw((undefined1  [16])*ptr_05,local_1a8);
                auVar36 = pblendvb(auVar36,auVar122,auVar38);
                iVar21 = 6;
                do {
                  auVar65._0_8_ = auVar57._0_8_ << 0x10;
                  auVar65._8_8_ = auVar57._8_8_ << 0x10 | auVar57._0_8_ >> 0x30;
                  auVar70._0_8_ = auVar69._0_8_ << 0x10;
                  auVar70._8_8_ = auVar69._8_8_ << 0x10 | auVar69._0_8_ >> 0x30;
                  auVar64 = paddsw(auVar70,auVar63);
                  sVar28 = auVar69._0_2_;
                  sVar46 = auVar64._0_2_;
                  auVar122._0_2_ = -(ushort)(sVar46 < sVar28);
                  sVar29 = auVar69._2_2_;
                  sVar47 = auVar64._2_2_;
                  auVar122._2_2_ = -(ushort)(sVar47 < sVar29);
                  sVar40 = auVar69._4_2_;
                  sVar49 = auVar64._4_2_;
                  auVar122._4_2_ = -(ushort)(sVar49 < sVar40);
                  sVar41 = auVar69._6_2_;
                  sVar50 = auVar64._6_2_;
                  auVar122._6_2_ = -(ushort)(sVar50 < sVar41);
                  sVar42 = auVar69._8_2_;
                  sVar51 = auVar64._8_2_;
                  auVar122._8_2_ = -(ushort)(sVar51 < sVar42);
                  sVar43 = auVar69._10_2_;
                  sVar52 = auVar64._10_2_;
                  auVar122._10_2_ = -(ushort)(sVar52 < sVar43);
                  sVar44 = auVar69._12_2_;
                  sVar53 = auVar64._12_2_;
                  sVar45 = auVar69._14_2_;
                  auVar122._12_2_ = -(ushort)(sVar53 < sVar44);
                  sVar54 = auVar64._14_2_;
                  auVar122._14_2_ = -(ushort)(sVar54 < sVar45);
                  auVar57 = pblendvb(auVar65,auVar57,auVar122);
                  auVar97._0_8_ = auVar35._0_8_ << 0x10;
                  auVar97._8_8_ = auVar35._8_8_ << 0x10 | auVar35._0_8_ >> 0x30;
                  auVar119._0_8_ = auVar36._0_8_ << 0x10;
                  auVar119._8_8_ = auVar36._8_8_ << 0x10 | auVar36._0_8_ >> 0x30;
                  auVar64 = paddsw(auVar119,auVar56);
                  uVar109 = (ushort)(sVar50 < sVar41) * sVar41 | (ushort)(sVar50 >= sVar41) * sVar50
                  ;
                  auVar69._0_8_ =
                       CONCAT26(uVar109,CONCAT24((ushort)(sVar49 < sVar40) * sVar40 |
                                                 (ushort)(sVar49 >= sVar40) * sVar49,
                                                 CONCAT22((ushort)(sVar47 < sVar29) * sVar29 |
                                                          (ushort)(sVar47 >= sVar29) * sVar47,
                                                          (ushort)(sVar46 < sVar28) * sVar28 |
                                                          (ushort)(sVar46 >= sVar28) * sVar46)));
                  auVar69._8_2_ =
                       (ushort)(sVar51 < sVar42) * sVar42 | (ushort)(sVar51 >= sVar42) * sVar51;
                  auVar69._10_2_ =
                       (ushort)(sVar52 < sVar43) * sVar43 | (ushort)(sVar52 >= sVar43) * sVar52;
                  auVar69._12_2_ =
                       (ushort)(sVar53 < sVar44) * sVar44 | (ushort)(sVar53 >= sVar44) * sVar53;
                  auVar69._14_2_ =
                       (ushort)(sVar54 < sVar45) * sVar45 | (ushort)(sVar54 >= sVar45) * sVar54;
                  auVar35 = pblendvb(auVar97,auVar35,auVar122);
                  auVar36 = pblendvb(auVar64,auVar36,auVar122);
                  iVar21 = iVar21 + -1;
                } while (iVar21 != 0);
                auVar115._0_8_ = auVar57._0_8_ << 0x10;
                auVar115._8_8_ = auVar57._8_8_ << 0x10 | auVar57._0_8_ >> 0x30;
                auVar117._0_8_ = auVar35._0_8_ << 0x10;
                auVar117._8_8_ = auVar35._8_8_ << 0x10 | auVar35._0_8_ >> 0x30;
                auVar120._0_8_ = auVar36._0_8_ << 0x10;
                auVar120._8_8_ = auVar36._8_8_ << 0x10 | auVar36._0_8_ >> 0x30;
                auVar71._0_8_ = auVar69._0_8_ << 0x10;
                auVar71._8_8_ = auVar69._8_8_ << 0x10 | (ulong)uVar109;
                auVar72 = paddsw(auVar71,ZEXT416(uVar10 & 0xffff));
                sVar28 = auVar72._0_2_;
                auVar39._0_2_ = -(ushort)((short)uVar107 < sVar28);
                sVar29 = auVar72._2_2_;
                auVar39._2_2_ = -(ushort)((short)uVar99 < sVar29);
                sVar40 = auVar72._4_2_;
                auVar39._4_2_ = -(ushort)((short)uVar101 < sVar40);
                sVar41 = auVar72._6_2_;
                auVar39._6_2_ = -(ushort)((short)uVar103 < sVar41);
                sVar42 = auVar72._8_2_;
                auVar39._8_2_ = -(ushort)((short)uVar105 < sVar42);
                sVar43 = auVar72._10_2_;
                auVar39._10_2_ = -(ushort)((short)auVar58._8_2_ < sVar43);
                sVar44 = auVar72._12_2_;
                sVar45 = auVar72._14_2_;
                auVar39._12_2_ = -(ushort)((short)auVar58._10_2_ < sVar44);
                auVar39._14_2_ = -(ushort)((short)auVar58._12_2_ < sVar45);
                auVar60._0_2_ =
                     (ushort)((short)uVar107 < sVar28) * sVar28 |
                     ((short)uVar107 >= sVar28) * uVar107;
                auVar60._2_2_ =
                     (ushort)((short)uVar99 < sVar29) * sVar29 | ((short)uVar99 >= sVar29) * uVar99;
                auVar60._4_2_ =
                     (ushort)((short)uVar101 < sVar40) * sVar40 |
                     ((short)uVar101 >= sVar40) * uVar101;
                auVar60._6_2_ =
                     (ushort)((short)uVar103 < sVar41) * sVar41 |
                     ((short)uVar103 >= sVar41) * uVar103;
                auVar60._8_2_ =
                     (ushort)((short)uVar105 < sVar42) * sVar42 |
                     ((short)uVar105 >= sVar42) * uVar105;
                auVar60._10_2_ =
                     (ushort)((short)auVar58._8_2_ < sVar43) * sVar43 |
                     ((short)auVar58._8_2_ >= sVar43) * auVar58._8_2_;
                auVar60._12_2_ =
                     (ushort)((short)auVar58._10_2_ < sVar44) * sVar44 |
                     ((short)auVar58._10_2_ >= sVar44) * auVar58._10_2_;
                auVar60._14_2_ =
                     (ushort)((short)auVar58._12_2_ < sVar45) * sVar45 |
                     ((short)auVar58._12_2_ >= sVar45) * auVar58._12_2_;
                auVar64 = pblendvb(local_198,auVar115,auVar39);
                auVar57 = pblendvb(local_1e8,auVar117,auVar39);
                auVar35 = pblendvb(local_1a8,auVar120,auVar39);
                lVar15 = 0;
                auVar36 = pmovsxbw(local_1e8,0x101010101010101);
                do {
                  auVar116 = psubsw(auVar60,auVar121);
                  auVar58 = psubsw(auVar72,auVar33);
                  sVar28 = auVar116._0_2_;
                  sVar46 = auVar58._0_2_;
                  auVar61._0_2_ = -(ushort)(sVar46 < sVar28);
                  sVar29 = auVar116._2_2_;
                  sVar47 = auVar58._2_2_;
                  auVar61._2_2_ = -(ushort)(sVar47 < sVar29);
                  sVar40 = auVar116._4_2_;
                  sVar49 = auVar58._4_2_;
                  auVar61._4_2_ = -(ushort)(sVar49 < sVar40);
                  sVar41 = auVar116._6_2_;
                  sVar50 = auVar58._6_2_;
                  auVar61._6_2_ = -(ushort)(sVar50 < sVar41);
                  sVar42 = auVar116._8_2_;
                  sVar51 = auVar58._8_2_;
                  auVar61._8_2_ = -(ushort)(sVar51 < sVar42);
                  sVar43 = auVar116._10_2_;
                  sVar52 = auVar58._10_2_;
                  auVar61._10_2_ = -(ushort)(sVar52 < sVar43);
                  sVar44 = auVar116._12_2_;
                  sVar53 = auVar58._12_2_;
                  sVar45 = auVar116._14_2_;
                  auVar61._12_2_ = -(ushort)(sVar53 < sVar44);
                  sVar54 = auVar58._14_2_;
                  auVar61._14_2_ = -(ushort)(sVar54 < sVar45);
                  auVar115 = pblendvb(auVar115,auVar64,auVar61);
                  auVar117 = pblendvb(auVar117,auVar57,auVar61);
                  puVar1 = (ushort *)((long)*ptr + lVar15);
                  uVar99 = *puVar1;
                  uVar101 = puVar1[1];
                  uVar103 = puVar1[2];
                  uVar105 = puVar1[3];
                  uVar107 = puVar1[4];
                  uVar109 = puVar1[5];
                  uVar111 = puVar1[6];
                  uVar113 = puVar1[7];
                  auVar57 = pblendvb(auVar120,auVar35,auVar61);
                  auVar72._0_2_ =
                       (ushort)(sVar28 < sVar46) * sVar46 | (ushort)(sVar28 >= sVar46) * sVar28;
                  auVar72._2_2_ =
                       (ushort)(sVar29 < sVar47) * sVar47 | (ushort)(sVar29 >= sVar47) * sVar29;
                  auVar72._4_2_ =
                       (ushort)(sVar40 < sVar49) * sVar49 | (ushort)(sVar40 >= sVar49) * sVar40;
                  auVar72._6_2_ =
                       (ushort)(sVar41 < sVar50) * sVar50 | (ushort)(sVar41 >= sVar50) * sVar41;
                  auVar72._8_2_ =
                       (ushort)(sVar42 < sVar51) * sVar51 | (ushort)(sVar42 >= sVar51) * sVar42;
                  auVar72._10_2_ =
                       (ushort)(sVar43 < sVar52) * sVar52 | (ushort)(sVar43 >= sVar52) * sVar43;
                  auVar72._12_2_ =
                       (ushort)(sVar44 < sVar53) * sVar53 | (ushort)(sVar44 >= sVar53) * sVar44;
                  auVar72._14_2_ =
                       (ushort)(sVar45 < sVar54) * sVar54 | (ushort)(sVar45 >= sVar54) * sVar45;
                  psVar2 = (short *)((long)*b + lVar15);
                  sVar28 = *psVar2;
                  sVar29 = psVar2[1];
                  sVar40 = psVar2[2];
                  sVar41 = psVar2[3];
                  sVar42 = psVar2[4];
                  sVar43 = psVar2[5];
                  sVar44 = psVar2[6];
                  sVar45 = psVar2[7];
                  uVar68 = (sVar28 < (short)uVar99) * uVar99 |
                           (ushort)(sVar28 >= (short)uVar99) * sVar28;
                  uVar74 = (sVar29 < (short)uVar101) * uVar101 |
                           (ushort)(sVar29 >= (short)uVar101) * sVar29;
                  uVar75 = (sVar40 < (short)uVar103) * uVar103 |
                           (ushort)(sVar40 >= (short)uVar103) * sVar40;
                  uVar76 = (sVar41 < (short)uVar105) * uVar105 |
                           (ushort)(sVar41 >= (short)uVar105) * sVar41;
                  uVar77 = (sVar42 < (short)uVar107) * uVar107 |
                           (ushort)(sVar42 >= (short)uVar107) * sVar42;
                  uVar78 = (sVar43 < (short)uVar109) * uVar109 |
                           (ushort)(sVar43 >= (short)uVar109) * sVar43;
                  uVar79 = (sVar44 < (short)uVar111) * uVar111 |
                           (ushort)(sVar44 >= (short)uVar111) * sVar44;
                  uVar80 = (sVar45 < (short)uVar113) * uVar113 |
                           (ushort)(sVar45 >= (short)uVar113) * sVar45;
                  auVar60._0_2_ =
                       ((short)uVar68 < (short)auVar72._0_2_) * auVar72._0_2_ |
                       ((short)uVar68 >= (short)auVar72._0_2_) * uVar68;
                  auVar60._2_2_ =
                       ((short)uVar74 < (short)auVar72._2_2_) * auVar72._2_2_ |
                       ((short)uVar74 >= (short)auVar72._2_2_) * uVar74;
                  auVar60._4_2_ =
                       ((short)uVar75 < (short)auVar72._4_2_) * auVar72._4_2_ |
                       ((short)uVar75 >= (short)auVar72._4_2_) * uVar75;
                  auVar60._6_2_ =
                       ((short)uVar76 < (short)auVar72._6_2_) * auVar72._6_2_ |
                       ((short)uVar76 >= (short)auVar72._6_2_) * uVar76;
                  auVar60._8_2_ =
                       ((short)uVar77 < (short)auVar72._8_2_) * auVar72._8_2_ |
                       ((short)uVar77 >= (short)auVar72._8_2_) * uVar77;
                  auVar60._10_2_ =
                       ((short)uVar78 < (short)auVar72._10_2_) * auVar72._10_2_ |
                       ((short)uVar78 >= (short)auVar72._10_2_) * uVar78;
                  auVar60._12_2_ =
                       ((short)uVar79 < (short)auVar72._12_2_) * auVar72._12_2_ |
                       ((short)uVar79 >= (short)auVar72._12_2_) * uVar79;
                  auVar60._14_2_ =
                       ((short)uVar80 < (short)auVar72._14_2_) * auVar72._14_2_ |
                       ((short)uVar80 >= (short)auVar72._14_2_) * uVar80;
                  auVar66._0_2_ = -(ushort)(uVar99 == auVar60._0_2_);
                  auVar66._2_2_ = -(ushort)(uVar101 == auVar60._2_2_);
                  auVar66._4_2_ = -(ushort)(uVar103 == auVar60._4_2_);
                  auVar66._6_2_ = -(ushort)(uVar105 == auVar60._6_2_);
                  auVar66._8_2_ = -(ushort)(uVar107 == auVar60._8_2_);
                  auVar66._10_2_ = -(ushort)(uVar109 == auVar60._10_2_);
                  auVar66._12_2_ = -(ushort)(uVar111 == auVar60._12_2_);
                  auVar66._14_2_ = -(ushort)(uVar113 == auVar60._14_2_);
                  auVar73._0_2_ = -(ushort)((short)auVar72._0_2_ < (short)uVar68);
                  auVar73._2_2_ = -(ushort)((short)auVar72._2_2_ < (short)uVar74);
                  auVar73._4_2_ = -(ushort)((short)auVar72._4_2_ < (short)uVar75);
                  auVar73._6_2_ = -(ushort)((short)auVar72._6_2_ < (short)uVar76);
                  auVar73._8_2_ = -(ushort)((short)auVar72._8_2_ < (short)uVar77);
                  auVar73._10_2_ = -(ushort)((short)auVar72._10_2_ < (short)uVar78);
                  auVar73._12_2_ = -(ushort)((short)auVar72._12_2_ < (short)uVar79);
                  auVar73._14_2_ = -(ushort)((short)auVar72._14_2_ < (short)uVar80);
                  auVar35 = pblendvb(auVar115,*(undefined1 (*) [16])((long)*b_00 + lVar15),auVar73);
                  auVar64 = pblendvb(auVar35,*(undefined1 (*) [16])((long)*b_03 + lVar15),auVar66);
                  auVar120 = paddsw(auVar57,auVar36);
                  auVar57 = pblendvb(auVar117,*(undefined1 (*) [16])((long)*b_01 + lVar15),auVar73);
                  auVar57 = pblendvb(auVar57,*(undefined1 (*) [16])((long)*b_04 + lVar15),auVar66);
                  auVar35 = pblendvb(auVar120,*(undefined1 (*) [16])((long)*b_02 + lVar15),auVar73);
                  auVar35 = pblendvb(auVar35,*(undefined1 (*) [16])((long)*b_05 + lVar15),auVar66);
                  *(undefined1 (*) [16])((long)*ptr + lVar15) = auVar60;
                  *(undefined1 (*) [16])((long)*b_03 + lVar15) = auVar64;
                  *(undefined1 (*) [16])((long)*b_04 + lVar15) = auVar57;
                  *(undefined1 (*) [16])((long)*b_05 + lVar15) = auVar35;
                  uVar123 = ((short)auVar60._0_2_ < (short)uVar123) * auVar60._0_2_ |
                            ((short)auVar60._0_2_ >= (short)uVar123) * uVar123;
                  uVar124 = ((short)auVar60._2_2_ < (short)uVar124) * auVar60._2_2_ |
                            ((short)auVar60._2_2_ >= (short)uVar124) * uVar124;
                  uVar125 = ((short)auVar60._4_2_ < (short)uVar125) * auVar60._4_2_ |
                            ((short)auVar60._4_2_ >= (short)uVar125) * uVar125;
                  uVar126 = ((short)auVar60._6_2_ < (short)uVar126) * auVar60._6_2_ |
                            ((short)auVar60._6_2_ >= (short)uVar126) * uVar126;
                  uVar127 = ((short)auVar60._8_2_ < (short)uVar127) * auVar60._8_2_ |
                            ((short)auVar60._8_2_ >= (short)uVar127) * uVar127;
                  uVar128 = ((short)auVar60._10_2_ < (short)uVar128) * auVar60._10_2_ |
                            ((short)auVar60._10_2_ >= (short)uVar128) * uVar128;
                  uVar129 = ((short)auVar60._12_2_ < (short)uVar129) * auVar60._12_2_ |
                            ((short)auVar60._12_2_ >= (short)uVar129) * uVar129;
                  uVar130 = ((short)auVar60._14_2_ < (short)uVar130) * auVar60._14_2_ |
                            ((short)auVar60._14_2_ >= (short)uVar130) * uVar130;
                  uVar81 = ((short)uVar81 < (short)auVar60._0_2_) * auVar60._0_2_ |
                           ((short)uVar81 >= (short)auVar60._0_2_) * uVar81;
                  uVar82 = ((short)uVar82 < (short)auVar60._2_2_) * auVar60._2_2_ |
                           ((short)uVar82 >= (short)auVar60._2_2_) * uVar82;
                  uVar83 = ((short)uVar83 < (short)auVar60._4_2_) * auVar60._4_2_ |
                           ((short)uVar83 >= (short)auVar60._4_2_) * uVar83;
                  uVar84 = ((short)uVar84 < (short)auVar60._6_2_) * auVar60._6_2_ |
                           ((short)uVar84 >= (short)auVar60._6_2_) * uVar84;
                  uVar85 = ((short)uVar85 < (short)auVar60._8_2_) * auVar60._8_2_ |
                           ((short)uVar85 >= (short)auVar60._8_2_) * uVar85;
                  uVar86 = ((short)uVar86 < (short)auVar60._10_2_) * auVar60._10_2_ |
                           ((short)uVar86 >= (short)auVar60._10_2_) * uVar86;
                  uVar87 = ((short)uVar87 < (short)auVar60._12_2_) * auVar60._12_2_ |
                           ((short)uVar87 >= (short)auVar60._12_2_) * uVar87;
                  uVar88 = ((short)uVar88 < (short)auVar60._14_2_) * auVar60._14_2_ |
                           ((short)uVar88 >= (short)auVar60._14_2_) * uVar88;
                  sVar28 = auVar64._0_2_;
                  uVar81 = (ushort)((short)uVar81 < sVar28) * sVar28 |
                           ((short)uVar81 >= sVar28) * uVar81;
                  sVar28 = auVar64._2_2_;
                  uVar82 = (ushort)((short)uVar82 < sVar28) * sVar28 |
                           ((short)uVar82 >= sVar28) * uVar82;
                  sVar28 = auVar64._4_2_;
                  uVar83 = (ushort)((short)uVar83 < sVar28) * sVar28 |
                           ((short)uVar83 >= sVar28) * uVar83;
                  sVar28 = auVar64._6_2_;
                  uVar84 = (ushort)((short)uVar84 < sVar28) * sVar28 |
                           ((short)uVar84 >= sVar28) * uVar84;
                  sVar28 = auVar64._8_2_;
                  uVar85 = (ushort)((short)uVar85 < sVar28) * sVar28 |
                           ((short)uVar85 >= sVar28) * uVar85;
                  sVar28 = auVar64._10_2_;
                  uVar86 = (ushort)((short)uVar86 < sVar28) * sVar28 |
                           ((short)uVar86 >= sVar28) * uVar86;
                  sVar28 = auVar64._12_2_;
                  uVar87 = (ushort)((short)uVar87 < sVar28) * sVar28 |
                           ((short)uVar87 >= sVar28) * uVar87;
                  sVar28 = auVar64._14_2_;
                  uVar88 = (ushort)((short)uVar88 < sVar28) * sVar28 |
                           ((short)uVar88 >= sVar28) * uVar88;
                  sVar28 = auVar35._0_2_;
                  sVar29 = auVar57._0_2_;
                  uVar99 = (ushort)(sVar29 < sVar28) * sVar28 | (ushort)(sVar29 >= sVar28) * sVar29;
                  sVar28 = auVar35._2_2_;
                  sVar29 = auVar57._2_2_;
                  uVar101 = (ushort)(sVar29 < sVar28) * sVar28 | (ushort)(sVar29 >= sVar28) * sVar29
                  ;
                  sVar28 = auVar35._4_2_;
                  sVar29 = auVar57._4_2_;
                  uVar103 = (ushort)(sVar29 < sVar28) * sVar28 | (ushort)(sVar29 >= sVar28) * sVar29
                  ;
                  sVar28 = auVar35._6_2_;
                  sVar29 = auVar57._6_2_;
                  uVar105 = (ushort)(sVar29 < sVar28) * sVar28 | (ushort)(sVar29 >= sVar28) * sVar29
                  ;
                  sVar28 = auVar35._8_2_;
                  sVar29 = auVar57._8_2_;
                  uVar107 = (ushort)(sVar29 < sVar28) * sVar28 | (ushort)(sVar29 >= sVar28) * sVar29
                  ;
                  sVar28 = auVar35._10_2_;
                  sVar29 = auVar57._10_2_;
                  uVar109 = (ushort)(sVar29 < sVar28) * sVar28 | (ushort)(sVar29 >= sVar28) * sVar29
                  ;
                  sVar28 = auVar35._12_2_;
                  sVar29 = auVar57._12_2_;
                  sVar40 = auVar57._14_2_;
                  uVar111 = (ushort)(sVar29 < sVar28) * sVar28 | (ushort)(sVar29 >= sVar28) * sVar29
                  ;
                  sVar28 = auVar35._14_2_;
                  uVar113 = (ushort)(sVar40 < sVar28) * sVar28 | (ushort)(sVar40 >= sVar28) * sVar40
                  ;
                  uVar81 = ((short)uVar99 < (short)uVar81) * uVar81 |
                           ((short)uVar99 >= (short)uVar81) * uVar99;
                  uVar82 = ((short)uVar101 < (short)uVar82) * uVar82 |
                           ((short)uVar101 >= (short)uVar82) * uVar101;
                  uVar83 = ((short)uVar103 < (short)uVar83) * uVar83 |
                           ((short)uVar103 >= (short)uVar83) * uVar103;
                  uVar84 = ((short)uVar105 < (short)uVar84) * uVar84 |
                           ((short)uVar105 >= (short)uVar84) * uVar105;
                  uVar85 = ((short)uVar107 < (short)uVar85) * uVar85 |
                           ((short)uVar107 >= (short)uVar85) * uVar107;
                  uVar86 = ((short)uVar109 < (short)uVar86) * uVar86 |
                           ((short)uVar109 >= (short)uVar86) * uVar109;
                  uVar87 = ((short)uVar111 < (short)uVar87) * uVar87 |
                           ((short)uVar111 >= (short)uVar87) * uVar111;
                  uVar88 = ((short)uVar113 < (short)uVar88) * uVar88 |
                           ((short)uVar113 >= (short)uVar88) * uVar113;
                  lVar15 = lVar15 + 0x10;
                } while (lVar13 != lVar15);
              } while (uVar22 != uVar18);
              uVar26 = ptr[uVar27][0];
              uVar18 = ptr[uVar27][1];
              uVar22 = b_03[uVar27][0];
              uVar67 = b_03[uVar27][1];
              uVar55 = b_04[uVar27][0];
              uVar62 = b_04[uVar27][1];
              uVar32 = b_05[uVar27][0];
              uVar48 = b_05[uVar27][1];
              if (iVar19 / (int)uVar25 < 7) {
                iVar21 = 1;
                if (1 < iVar9) {
                  iVar21 = iVar9;
                }
                do {
                  uVar18 = uVar18 << 0x10 | uVar26 >> 0x30;
                  uVar67 = uVar67 << 0x10 | uVar22 >> 0x30;
                  uVar62 = uVar62 << 0x10 | uVar55 >> 0x30;
                  uVar48 = uVar48 << 0x10 | uVar32 >> 0x30;
                  iVar21 = iVar21 + -1;
                  uVar26 = uVar26 << 0x10;
                  uVar22 = uVar22 << 0x10;
                  uVar55 = uVar55 << 0x10;
                  uVar32 = uVar32 << 0x10;
                } while (iVar21 != 0);
              }
              auVar56._0_2_ = -(ushort)((short)uVar123 < (short)local_148);
              auVar56._2_2_ = -(ushort)((short)uVar124 < (short)uStack_146);
              auVar56._4_2_ = -(ushort)((short)uVar125 < (short)local_148);
              auVar56._6_2_ = -(ushort)((short)uVar126 < (short)uStack_146);
              auVar56._8_2_ = -(ushort)((short)uVar127 < (short)local_148);
              auVar56._10_2_ = -(ushort)((short)uVar128 < (short)uStack_146);
              auVar56._12_2_ = -(ushort)((short)uVar129 < (short)local_148);
              auVar56._14_2_ = -(ushort)((short)uVar130 < (short)uStack_146);
              auVar34._0_2_ = -(ushort)((short)local_b8 < (short)uVar81);
              auVar34._2_2_ = -(ushort)((short)uStack_b6 < (short)uVar82);
              auVar34._4_2_ = -(ushort)((short)local_b8 < (short)uVar83);
              auVar34._6_2_ = -(ushort)((short)uStack_b6 < (short)uVar84);
              auVar34._8_2_ = -(ushort)((short)local_b8 < (short)uVar85);
              auVar34._10_2_ = -(ushort)((short)uStack_b6 < (short)uVar86);
              auVar34._12_2_ = -(ushort)((short)local_b8 < (short)uVar87);
              auVar34._14_2_ = -(ushort)((short)uStack_b6 < (short)uVar88);
              auVar34 = auVar34 | auVar56;
              if ((((((((((((((((auVar34 >> 7 & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                               (auVar34 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                              (auVar34 >> 0x17 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                             (auVar34 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                            (auVar34 >> 0x27 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                           (auVar34 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                          (auVar34 >> 0x37 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                         (auVar34 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                        (auVar34 >> 0x47 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                       (auVar34 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                      (auVar34 >> 0x57 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                     (auVar34 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    (auVar34 >> 0x67 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                   (auVar34 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar34 >> 0x77 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  -1 < auVar34[0xf]) {
                sVar28 = (short)(uVar18 >> 0x30);
                sVar29 = (short)(uVar67 >> 0x30);
                sVar40 = (short)(uVar62 >> 0x30);
                sVar41 = (short)(uVar48 >> 0x30);
              }
              else {
                *(byte *)&ppVar12->flag = (byte)ppVar12->flag | 0x40;
                sVar28 = 0;
                sVar29 = 0;
                sVar40 = 0;
                sVar41 = 0;
                iVar8 = 0;
                iVar19 = 0;
              }
              ppVar12->score = (int)sVar28;
              ppVar12->end_query = iVar19;
              ppVar12->end_ref = iVar8;
              *(int *)(ppVar12->field_4).extra = (int)sVar29;
              ((ppVar12->field_4).stats)->similar = (int)sVar40;
              ((ppVar12->field_4).stats)->length = (int)sVar41;
              parasail_free(ptr_06);
              parasail_free(ptr_05);
              parasail_free(ptr_04);
              parasail_free(ptr_03);
              parasail_free(ptr_02);
              parasail_free(ptr_01);
              parasail_free(ptr_00);
              parasail_free(b_05);
              parasail_free(b_04);
              parasail_free(b_03);
              parasail_free(ptr);
              parasail_free(b_02);
              parasail_free(b_01);
              parasail_free(b_00);
              parasail_free(b);
              return ppVar12;
            }
          }
        }
      }
    }
  }
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t s1Len = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
    int32_t offset = 0;
    int32_t position = 0;
    __m128i* restrict pvP = NULL;
    __m128i* restrict pvPm = NULL;
    __m128i* restrict pvPs = NULL;
    __m128i* restrict pvE = NULL;
    __m128i* restrict pvEM = NULL;
    __m128i* restrict pvES = NULL;
    __m128i* restrict pvEL = NULL;
    __m128i* restrict pvH = NULL;
    __m128i* restrict pvHM = NULL;
    __m128i* restrict pvHS = NULL;
    __m128i* restrict pvHL = NULL;
    __m128i* restrict pvHMax = NULL;
    __m128i* restrict pvHMMax = NULL;
    __m128i* restrict pvHSMax = NULL;
    __m128i* restrict pvHLMax = NULL;
    __m128i* restrict pvGapper = NULL;
    __m128i* restrict pvGapperL = NULL;
    int16_t* restrict boundary = NULL;
    __m128i vGapO;
    __m128i vGapE;
    int16_t NEG_LIMIT = 0;
    int16_t POS_LIMIT = 0;
    __m128i vZero;
    __m128i vOne;
    int16_t score = 0;
    int16_t matches = 0;
    int16_t similar = 0;
    int16_t length = 0;
    __m128i vNegLimit;
    __m128i vPosLimit;
    __m128i vSaturationCheckMin;
    __m128i vSaturationCheckMax;
    __m128i vNegInfFront;
    __m128i vSegLenXgap;
    __m128i vSegLen;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile16.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    s1Len = profile->s1Len;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    matrix = profile->matrix;
    segWidth = 8; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
    pvP  = (__m128i*)profile->profile16.score;
    pvPm = (__m128i*)profile->profile16.matches;
    pvPs = (__m128i*)profile->profile16.similar;
    vGapO = _mm_set1_epi16(open);
    vGapE = _mm_set1_epi16(gap);
    NEG_LIMIT = (-open < matrix->min ? INT16_MIN + open : INT16_MIN - matrix->min) + 1;
    POS_LIMIT = INT16_MAX - matrix->max - 1;
    vZero = _mm_setzero_si128();
    vOne = _mm_set1_epi16(1);
    score = NEG_LIMIT;
    matches = 0;
    similar = 0;
    length = 0;
    vNegLimit = _mm_set1_epi16(NEG_LIMIT);
    vPosLimit = _mm_set1_epi16(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vNegInfFront = vZero;
    vSegLen = _mm_slli_si128(_mm_set1_epi16(segLen), 2);
    vNegInfFront = _mm_insert_epi16(vNegInfFront, NEG_LIMIT, 0);
    vSegLenXgap = _mm_adds_epi16(vNegInfFront,
            _mm_slli_si128(_mm_set1_epi16(-segLen*gap), 2));

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table3(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol3(segLen*segWidth, s2Len);
#else
    result = parasail_result_new_stats();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_NW | PARASAIL_FLAG_SCAN
        | PARASAIL_FLAG_STATS
        | PARASAIL_FLAG_BITS_16 | PARASAIL_FLAG_LANES_8;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvE  = parasail_memalign___m128i(16, segLen);
    pvEM = parasail_memalign___m128i(16, segLen);
    pvES = parasail_memalign___m128i(16, segLen);
    pvEL = parasail_memalign___m128i(16, segLen);
    pvH  = parasail_memalign___m128i(16, segLen);
    pvHM = parasail_memalign___m128i(16, segLen);
    pvHS = parasail_memalign___m128i(16, segLen);
    pvHL = parasail_memalign___m128i(16, segLen);
    pvHMax  = parasail_memalign___m128i(16, segLen);
    pvHMMax = parasail_memalign___m128i(16, segLen);
    pvHSMax = parasail_memalign___m128i(16, segLen);
    pvHLMax = parasail_memalign___m128i(16, segLen);
    pvGapper = parasail_memalign___m128i(16, segLen);
    pvGapperL = parasail_memalign___m128i(16, segLen);
    boundary = parasail_memalign_int16_t(16, s2Len+1);

    /* validate heap variables */
    if (!pvE) return NULL;
    if (!pvEM) return NULL;
    if (!pvES) return NULL;
    if (!pvEL) return NULL;
    if (!pvH) return NULL;
    if (!pvHM) return NULL;
    if (!pvHS) return NULL;
    if (!pvHL) return NULL;
    if (!pvHMax) return NULL;
    if (!pvHMMax) return NULL;
    if (!pvHSMax) return NULL;
    if (!pvHLMax) return NULL;
    if (!pvGapper) return NULL;
    if (!pvGapperL) return NULL;
    if (!boundary) return NULL;

    parasail_memset___m128i(pvHM, vZero, segLen);
    parasail_memset___m128i(pvHS, vZero, segLen);
    parasail_memset___m128i(pvHL, vZero, segLen);
    parasail_memset___m128i(pvE, vNegLimit, segLen);
    parasail_memset___m128i(pvEM, vZero, segLen);
    parasail_memset___m128i(pvES, vZero, segLen);
    parasail_memset___m128i(pvEL, vZero, segLen);
    {
        __m128i vGapper = _mm_subs_epi16(vZero,vGapO);
        __m128i vGapperL = vOne;
        for (i=segLen-1; i>=0; --i) {
            _mm_store_si128(pvGapper+i, vGapper);
            _mm_store_si128(pvGapperL+i, vGapperL);
            vGapper = _mm_subs_epi16(vGapper, vGapE);
            vGapperL = _mm_adds_epi16(vGapperL, vOne);
        }
    }

    /* initialize H */
    {
        int32_t index = 0;
        for (i=0; i<segLen; ++i) {
            int32_t segNum = 0;
            __m128i_16_t h;
            for (segNum=0; segNum<segWidth; ++segNum) {
                int64_t tmp = -open-gap*(segNum*segLen+i);
                h.v[segNum] = tmp < INT16_MIN ? INT16_MIN : tmp;
            }
            _mm_store_si128(&pvH[index], h.m);
            ++index;
        }
    }

    /* initialize uppder boundary */
    {
        boundary[0] = 0;
        for (i=1; i<=s2Len; ++i) {
            int64_t tmp = -open-gap*(i-1);
            boundary[i] = tmp < INT16_MIN ? INT16_MIN : tmp;
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m128i vE;
        __m128i vE_ext;
        __m128i vE_opn;
        __m128i vEM;
        __m128i vES;
        __m128i vEL;
        __m128i vHt;
        __m128i vHtM;
        __m128i vHtS;
        __m128i vHtL;
        __m128i vF;
        __m128i vF_ext;
        __m128i vF_opn;
        __m128i vFM;
        __m128i vFS;
        __m128i vFL;
        __m128i vH;
        __m128i vHM;
        __m128i vHS;
        __m128i vHL;
        __m128i vHp;
        __m128i vHpM;
        __m128i vHpS;
        __m128i vHpL;
        __m128i *pvW;
        __m128i vW;
        __m128i *pvWM;
        __m128i vWM;
        __m128i *pvWS;
        __m128i vWS;
        __m128i case1;
        __m128i case2;
        __m128i vGapper;
        __m128i vGapperL;

        /* calculate E */
        /* calculate Ht */
        /* calculate F and H first pass */
        vHp = _mm_load_si128(pvH+(segLen-1));
        vHpM = _mm_load_si128(pvHM+(segLen-1));
        vHpS = _mm_load_si128(pvHS+(segLen-1));
        vHpL = _mm_load_si128(pvHL+(segLen-1));
        vHp = _mm_slli_si128(vHp, 2);
        vHpM = _mm_slli_si128(vHpM, 2);
        vHpS = _mm_slli_si128(vHpS, 2);
        vHpL = _mm_slli_si128(vHpL, 2);
        vHp = _mm_insert_epi16(vHp, boundary[j], 0);
        pvW = pvP + matrix->mapper[(unsigned char)s2[j]]*segLen;
        pvWM= pvPm+ matrix->mapper[(unsigned char)s2[j]]*segLen;
        pvWS= pvPs+ matrix->mapper[(unsigned char)s2[j]]*segLen;
        vHt = _mm_subs_epi16(vNegLimit, pvGapper[0]);
        vF = vNegLimit;
        vFM = vZero;
        vFS = vZero;
        vFL = vZero;
        for (i=0; i<segLen; ++i) {
            vH = _mm_load_si128(pvH+i);
            vHM= _mm_load_si128(pvHM+i);
            vHS= _mm_load_si128(pvHS+i);
            vHL= _mm_load_si128(pvHL+i);
            vE = _mm_load_si128(pvE+i);
            vEM= _mm_load_si128(pvEM+i);
            vES= _mm_load_si128(pvES+i);
            vEL= _mm_load_si128(pvEL+i);
            vW = _mm_load_si128(pvW+i);
            vWM = _mm_load_si128(pvWM+i);
            vWS = _mm_load_si128(pvWS+i);
            vGapper = _mm_load_si128(pvGapper+i);
            vGapperL = _mm_load_si128(pvGapperL+i);
            vE_opn = _mm_subs_epi16(vH, vGapO);
            vE_ext = _mm_subs_epi16(vE, vGapE);
            case1 = _mm_cmpgt_epi16(vE_opn, vE_ext);
            vE = _mm_max_epi16(vE_opn, vE_ext);
            vEM = _mm_blendv_epi8(vEM, vHM, case1);
            vES = _mm_blendv_epi8(vES, vHS, case1);
            vEL = _mm_blendv_epi8(vEL, vHL, case1);
            vEL = _mm_adds_epi16(vEL, vOne);
            vGapper = _mm_adds_epi16(vHt, vGapper);
            case1 = _mm_or_si128(
                    _mm_cmpgt_epi16(vF, vGapper),
                    _mm_cmpeq_epi16(vF, vGapper));
            vF = _mm_max_epi16(vF, vGapper);
            vFM = _mm_blendv_epi8(vHtM, vFM, case1);
            vFS = _mm_blendv_epi8(vHtS, vFS, case1);
            vFL = _mm_blendv_epi8(
                    _mm_adds_epi16(vHtL, vGapperL),
                    vFL, case1);
            vHp = _mm_adds_epi16(vHp, vW);
            vHpM = _mm_adds_epi16(vHpM, vWM);
            vHpS = _mm_adds_epi16(vHpS, vWS);
            vHpL = _mm_adds_epi16(vHpL, vOne);
            case1 = _mm_cmpgt_epi16(vE, vHp);
            vHt = _mm_max_epi16(vE, vHp);
            vHtM = _mm_blendv_epi8(vHpM, vEM, case1);
            vHtS = _mm_blendv_epi8(vHpS, vES, case1);
            vHtL = _mm_blendv_epi8(vHpL, vEL, case1);
            _mm_store_si128(pvE+i, vE);
            _mm_store_si128(pvEM+i, vEM);
            _mm_store_si128(pvES+i, vES);
            _mm_store_si128(pvEL+i, vEL);
            _mm_store_si128(pvH+i, vHp);
            _mm_store_si128(pvHM+i, vHpM);
            _mm_store_si128(pvHS+i, vHpS);
            _mm_store_si128(pvHL+i, vHpL);
            vHp = vH;
            vHpM = vHM;
            vHpS = vHS;
            vHpL = vHL;
        }

        /* pseudo prefix scan on F and H */
        vHt = _mm_slli_si128(vHt, 2);
        vHtM = _mm_slli_si128(vHtM, 2);
        vHtS = _mm_slli_si128(vHtS, 2);
        vHtL = _mm_slli_si128(vHtL, 2);
        vHt = _mm_insert_epi16(vHt, boundary[j+1], 0);
        vGapper = _mm_load_si128(pvGapper);
        vGapperL = _mm_load_si128(pvGapperL);
        vGapper = _mm_adds_epi16(vHt, vGapper);
        case1 = _mm_or_si128(
                _mm_cmpgt_epi16(vGapper, vF),
                _mm_cmpeq_epi16(vGapper, vF));
        vF = _mm_max_epi16(vF, vGapper);
        vFM = _mm_blendv_epi8(vFM, vHtM, case1);
        vFS = _mm_blendv_epi8(vFS, vHtS, case1);
        vFL = _mm_blendv_epi8(
                vFL,
                _mm_adds_epi16(vHtL, vGapperL),
                case1);
        for (i=0; i<segWidth-2; ++i) {
            __m128i vFt = _mm_slli_si128(vF, 2);
            __m128i vFtM = _mm_slli_si128(vFM, 2);
            __m128i vFtS = _mm_slli_si128(vFS, 2);
            __m128i vFtL = _mm_slli_si128(vFL, 2);
            vFt = _mm_adds_epi16(vFt, vSegLenXgap);
            case1 = _mm_or_si128(
                    _mm_cmpgt_epi16(vFt, vF),
                    _mm_cmpeq_epi16(vFt, vF));
            vF = _mm_max_epi16(vF, vFt);
            vFM = _mm_blendv_epi8(vFM, vFtM, case1);
            vFS = _mm_blendv_epi8(vFS, vFtS, case1);
            vFL = _mm_blendv_epi8(
                    vFL,
                    _mm_adds_epi16(vFtL, vSegLen),
                    case1);
        }

        /* calculate final H */
        vF = _mm_slli_si128(vF, 2);
        vFM = _mm_slli_si128(vFM, 2);
        vFS = _mm_slli_si128(vFS, 2);
        vFL = _mm_slli_si128(vFL, 2);
        vF = _mm_adds_epi16(vF, vNegInfFront);
        case1 = _mm_cmpgt_epi16(vF, vHt);
        vH = _mm_max_epi16(vF, vHt);
        vHM = _mm_blendv_epi8(vHtM, vFM, case1);
        vHS = _mm_blendv_epi8(vHtS, vFS, case1);
        vHL = _mm_blendv_epi8(vHtL, vFL, case1);
        for (i=0; i<segLen; ++i) {
            vHp = _mm_load_si128(pvH+i);
            vHpM = _mm_load_si128(pvHM+i);
            vHpS = _mm_load_si128(pvHS+i);
            vHpL = _mm_load_si128(pvHL+i);
            vE = _mm_load_si128(pvE+i);
            vEM = _mm_load_si128(pvEM+i);
            vES = _mm_load_si128(pvES+i);
            vEL = _mm_load_si128(pvEL+i);
            vF_opn = _mm_subs_epi16(vH, vGapO);
            vF_ext = _mm_subs_epi16(vF, vGapE);
            vF = _mm_max_epi16(vF_opn, vF_ext);
            case1 = _mm_cmpgt_epi16(vF_opn, vF_ext);
            vFM = _mm_blendv_epi8(vFM, vHM, case1);
            vFS = _mm_blendv_epi8(vFS, vHS, case1);
            vFL = _mm_blendv_epi8(vFL, vHL, case1);
            vFL = _mm_adds_epi16(vFL, vOne);
            vH = _mm_max_epi16(vHp, vE);
            vH = _mm_max_epi16(vH, vF);
            case1 = _mm_cmpeq_epi16(vH, vHp);
            case2 = _mm_cmpeq_epi16(vH, vF);
            vHM = _mm_blendv_epi8(
                    _mm_blendv_epi8(vEM, vFM, case2),
                    vHpM, case1);
            vHS = _mm_blendv_epi8(
                    _mm_blendv_epi8(vES, vFS, case2),
                    vHpS, case1);
            vHL = _mm_blendv_epi8(
                    _mm_blendv_epi8(vEL, vFL, case2),
                    vHpL, case1);
            _mm_store_si128(pvH+i, vH);
            _mm_store_si128(pvHM+i, vHM);
            _mm_store_si128(pvHS+i, vHS);
            _mm_store_si128(pvHL+i, vHL);
            vSaturationCheckMin = _mm_min_epi16(vSaturationCheckMin, vH);
            vSaturationCheckMax = _mm_max_epi16(vSaturationCheckMax, vH);
            vSaturationCheckMax = _mm_max_epi16(vSaturationCheckMax, vHM);
            vSaturationCheckMax = _mm_max_epi16(vSaturationCheckMax, vHS);
            vSaturationCheckMax = _mm_max_epi16(vSaturationCheckMax, vHL);
#ifdef PARASAIL_TABLE
            arr_store_si128(result->stats->tables->score_table, vH, i, segLen, j, s2Len);
            arr_store_si128(result->stats->tables->matches_table, vHM, i, segLen, j, s2Len);
            arr_store_si128(result->stats->tables->similar_table, vHS, i, segLen, j, s2Len);
            arr_store_si128(result->stats->tables->length_table, vHL, i, segLen, j, s2Len);
#endif
        } 

#ifdef PARASAIL_ROWCOL
        /* extract last value from the column */
        {
            vH = _mm_load_si128(pvH + offset);
            vHM = _mm_load_si128(pvHM + offset);
            vHS = _mm_load_si128(pvHS + offset);
            vHL = _mm_load_si128(pvHL + offset);
            for (k=0; k<position; ++k) {
                vH = _mm_slli_si128(vH, 2);
                vHM = _mm_slli_si128(vHM, 2);
                vHS = _mm_slli_si128(vHS, 2);
                vHL = _mm_slli_si128(vHL, 2);
            }
            result->stats->rowcols->score_row[j] = (int16_t) _mm_extract_epi16 (vH, 7);
            result->stats->rowcols->matches_row[j] = (int16_t) _mm_extract_epi16 (vHM, 7);
            result->stats->rowcols->similar_row[j] = (int16_t) _mm_extract_epi16 (vHS, 7);
            result->stats->rowcols->length_row[j] = (int16_t) _mm_extract_epi16 (vHL, 7);
        }
#endif
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m128i vH = _mm_load_si128(pvH+i);
        __m128i vHM = _mm_load_si128(pvHM+i);
        __m128i vHS = _mm_load_si128(pvHS+i);
        __m128i vHL = _mm_load_si128(pvHL+i);
        arr_store_col(result->stats->rowcols->score_col, vH, i, segLen);
        arr_store_col(result->stats->rowcols->matches_col, vHM, i, segLen);
        arr_store_col(result->stats->rowcols->similar_col, vHS, i, segLen);
        arr_store_col(result->stats->rowcols->length_col, vHL, i, segLen);
    }
#endif

    /* extract last value from the last column */
    {
        __m128i vH = _mm_load_si128(pvH + offset);
        __m128i vHM = _mm_load_si128(pvHM + offset);
        __m128i vHS = _mm_load_si128(pvHS + offset);
        __m128i vHL = _mm_load_si128(pvHL + offset);
        for (k=0; k<position; ++k) {
            vH = _mm_slli_si128(vH, 2);
            vHM = _mm_slli_si128(vHM, 2);
            vHS = _mm_slli_si128(vHS, 2);
            vHL = _mm_slli_si128(vHL, 2);
        }
        score = (int16_t) _mm_extract_epi16 (vH, 7);
        matches = (int16_t) _mm_extract_epi16 (vHM, 7);
        similar = (int16_t) _mm_extract_epi16 (vHS, 7);
        length = (int16_t) _mm_extract_epi16 (vHL, 7);
    }

    if (_mm_movemask_epi8(_mm_or_si128(
            _mm_cmplt_epi16(vSaturationCheckMin, vNegLimit),
            _mm_cmpgt_epi16(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        matches = 0;
        similar = 0;
        length = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;
    result->stats->matches = matches;
    result->stats->similar = similar;
    result->stats->length = length;

    parasail_free(boundary);
    parasail_free(pvGapperL);
    parasail_free(pvGapper);
    parasail_free(pvHLMax);
    parasail_free(pvHSMax);
    parasail_free(pvHMMax);
    parasail_free(pvHMax);
    parasail_free(pvHL);
    parasail_free(pvHS);
    parasail_free(pvHM);
    parasail_free(pvH);
    parasail_free(pvEL);
    parasail_free(pvES);
    parasail_free(pvEM);
    parasail_free(pvE);

    return result;
}